

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O0

void __thiscall
CompressedArray::find_best_radix_parameters
          (CompressedArray *this,vector<Record,_std::allocator<Record>_> *records)

{
  uint32_t uVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  vector<Record,_std::allocator<Record>_> *in_RSI;
  CompressedArray *in_RDI;
  uint32_t j_1;
  uint32_t index;
  uint32_t diff;
  uint32_t j;
  Record *prev_record;
  Record *record;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> unique_continuations_count_index_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> continuations_count_index_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ngram_count_index_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> context_index_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> context_index_diff_size;
  allocator_type *in_stack_fffffffffffffe68;
  value_type vVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe70;
  size_type in_stack_fffffffffffffe78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe80;
  uint *word;
  uint local_110;
  uint local_104;
  ulong local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  undefined8 local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  undefined8 local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  undefined1 local_69 [9];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60 [2];
  undefined8 local_30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  vector<Record,_std::allocator<Record>_> *local_10;
  
  local_30 = 0;
  local_10 = in_RSI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x160708);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (value_type_conflict4 *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x160739);
  local_69._1_8_ = 0;
  word = (uint *)local_69;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x16075a);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (value_type_conflict4 *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x16078b);
  local_90 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1607a9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (value_type_conflict4 *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1607d7);
  local_b8 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1607f5);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (value_type_conflict4 *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x160823);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x160841);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (value_type_conflict4 *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x16086f);
  local_f0 = 1;
  while( true ) {
    sVar2 = std::vector<Record,_std::allocator<Record>_>::size(local_10);
    if (sVar2 <= local_f0) break;
    pvVar3 = std::vector<Record,_std::allocator<Record>_>::operator[](local_10,local_f0);
    pvVar4 = std::vector<Record,_std::allocator<Record>_>::operator[](local_10,local_f0 - 1);
    for (local_104 = 0; local_104 < 8; local_104 = local_104 + 1) {
      if ((pvVar4->key).word_index == (pvVar3->key).word_index) {
        uVar1 = calculate_number_size
                          (in_RDI,(pvVar3->key).context_index - (pvVar4->key).context_index,
                           local_104 + 1);
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_28,(ulong)local_104);
        *pvVar5 = (ulong)uVar1 + *pvVar5;
      }
      else {
        uVar1 = calculate_number_size(in_RDI,(pvVar3->key).context_index,local_104 + 1);
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_60,(ulong)local_104);
        *pvVar5 = (ulong)uVar1 + *pvVar5;
      }
      uVar1 = Vocabulary<unsigned_int>::get_index((Vocabulary<unsigned_int> *)in_RDI,word);
      uVar1 = calculate_number_size(in_RDI,uVar1,local_104 + 1);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_88,(ulong)local_104);
      *pvVar5 = *pvVar5 + (ulong)uVar1;
      uVar1 = Vocabulary<unsigned_int>::get_index((Vocabulary<unsigned_int> *)in_RDI,word);
      uVar1 = calculate_number_size(in_RDI,uVar1,local_104 + 1);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_b0,(ulong)local_104);
      *pvVar5 = *pvVar5 + (ulong)uVar1;
      uVar1 = Vocabulary<unsigned_int>::get_index((Vocabulary<unsigned_int> *)in_RDI,word);
      uVar1 = calculate_number_size(in_RDI,uVar1,local_104 + 1);
      uVar6 = (ulong)uVar1;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_d8,(ulong)local_104);
      *pvVar5 = uVar6 + *pvVar5;
    }
    local_f0 = local_f0 + 1;
  }
  in_RDI->word_index_diff_log_radix = 2;
  in_RDI->context_index_diff_log_radix = 1;
  in_RDI->context_index_log_radix = 1;
  in_RDI->ngram_count_index_log_radix = 1;
  in_RDI->continuations_count_index_log_radix = 1;
  in_RDI->unique_continuations_count_index_log_radix = 1;
  for (local_110 = 0; local_110 < 8; local_110 = local_110 + 1) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_28,(ulong)(in_RDI->context_index_diff_log_radix - 1));
    vVar7 = *pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_28,(ulong)local_110);
    if (*pvVar5 < vVar7) {
      in_RDI->context_index_diff_log_radix = local_110 + 1;
    }
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_60,(ulong)(in_RDI->context_index_log_radix - 1));
    in_stack_fffffffffffffe70 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_60,(ulong)local_110);
    if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar5 < in_stack_fffffffffffffe70
       ) {
      in_RDI->context_index_log_radix = local_110 + 1;
    }
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_88,(ulong)(in_RDI->ngram_count_index_log_radix - 1));
    vVar7 = *pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_88,(ulong)local_110);
    if (*pvVar5 < vVar7) {
      in_RDI->ngram_count_index_log_radix = local_110 + 1;
    }
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_b0,(ulong)(in_RDI->continuations_count_index_log_radix - 1));
    uVar6 = *pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_b0,(ulong)local_110);
    if (*pvVar5 < uVar6) {
      in_RDI->continuations_count_index_log_radix = local_110 + 1;
    }
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_d8,(ulong)(in_RDI->unique_continuations_count_index_log_radix - 1));
    uVar6 = *pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_d8,(ulong)local_110);
    if (*pvVar5 < uVar6) {
      in_RDI->unique_continuations_count_index_log_radix = local_110 + 1;
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffe70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffe70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffe70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffe70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffe70);
  return;
}

Assistant:

void CompressedArray::find_best_radix_parameters(const vector<Record>& records) {
    vector<uint64_t> context_index_diff_size(8, 0);
    vector<uint64_t> context_index_size(8, 0);
    vector<uint64_t> ngram_count_index_size(8, 0);
    vector<uint64_t> continuations_count_index_size(8, 0);
    vector<uint64_t> unique_continuations_count_index_size(8, 0);

    for (size_t i = 1; i < records.size(); i++) {
        const Record& record = records[i];
        const Record& prev_record = records[i - 1];

        for (uint32_t j = 0; j < 8; j++) {
            if (prev_record.key.word_index == record.key.word_index) {
                uint32_t diff = record.key.context_index - prev_record.key.context_index;
                context_index_diff_size[j] += calculate_number_size(diff, j + 1);
            } else {
                context_index_size[j] += calculate_number_size(record.key.context_index, j + 1);
            }

            uint32_t index = ngram_count_values.get_index(record.value.ngram_count);
            ngram_count_index_size[j] += calculate_number_size(index, j + 1);
            index = continuations_count_values.get_index(record.value.continuations_count);
            continuations_count_index_size[j] += calculate_number_size(index, j + 1);
            index = unique_continuations_count_values.get_index(record.value.unique_continuations_count);
            unique_continuations_count_index_size[j] += calculate_number_size(index, j + 1);
        }
    }

    word_index_diff_log_radix = 2;
    context_index_diff_log_radix = 1;
    context_index_log_radix = 1;
    ngram_count_index_log_radix = 1;
    continuations_count_index_log_radix = 1;
    unique_continuations_count_index_log_radix = 1;
    for (uint32_t j = 0; j < 8; j++) {
        if (context_index_diff_size[context_index_diff_log_radix - 1] >
                context_index_diff_size[j])
            context_index_diff_log_radix = j + 1;
        if (context_index_size[context_index_log_radix - 1] >
                context_index_size[j])
            context_index_log_radix = j + 1;
        if (ngram_count_index_size[ngram_count_index_log_radix - 1] >
                ngram_count_index_size[j])
            ngram_count_index_log_radix = j + 1;
        if (continuations_count_index_size[continuations_count_index_log_radix - 1] >
                continuations_count_index_size[j])
            continuations_count_index_log_radix = j + 1;
        if (unique_continuations_count_index_size[unique_continuations_count_index_log_radix - 1] >
                unique_continuations_count_index_size[j])
            unique_continuations_count_index_log_radix = j + 1;
    }
}